

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::TraceInterpreterExecutionMode(FunctionBody *this)

{
  uint sourceContextId;
  bool bVar1;
  ExecutionMode EVar2;
  LocalFunctionId functionId;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,ExecutionModePhase,sourceContextId,functionId);
  if (bVar1) {
    EVar2 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
    if (EVar2 < SimpleJit) {
      DoTraceExecutionMode(this,(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::TraceInterpreterExecutionMode() const
    {
        executionState.AssertIsInitialized();

        if(!PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            return;
        }

        switch(GetExecutionMode())
        {
            case ExecutionMode::Interpreter:
            case ExecutionMode::AutoProfilingInterpreter:
            case ExecutionMode::ProfilingInterpreter:
                DoTraceExecutionMode(nullptr);
                break;
        }
    }